

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::initialdelaunay(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  verttype vVar5;
  tetrahedron ppdVar6;
  undefined1 local_a0 [8];
  triface worktet1;
  triface worktet;
  triface tetopd;
  triface tetopc;
  triface tetopb;
  triface tetopa;
  triface firsttet;
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&tetopa.ver);
  triface::triface((triface *)&tetopb.ver);
  triface::triface((triface *)&tetopc.ver);
  triface::triface((triface *)&tetopd.ver);
  triface::triface((triface *)&worktet.ver);
  triface::triface((triface *)&worktet1.ver);
  triface::triface((triface *)local_a0);
  if (2 < this->b->verbose) {
    uVar1 = pointmark(this,pa);
    uVar2 = pointmark(this,pb);
    uVar3 = pointmark(this,pc);
    uVar4 = pointmark(this,pd);
    printf("      Create init tet (%d, %d, %d, %d)\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
           (ulong)uVar4);
  }
  maketetrahedron(this,(triface *)&tetopa.ver);
  *(point *)(tetopa._8_8_ + (long)orgpivot[(int)firsttet.tet] * 8) = pa;
  *(point *)(tetopa._8_8_ + (long)destpivot[(int)firsttet.tet] * 8) = pb;
  *(point *)(tetopa._8_8_ + (long)apexpivot[(int)firsttet.tet] * 8) = pc;
  *(point *)(tetopa._8_8_ + (long)oppopivot[(int)firsttet.tet] * 8) = pd;
  maketetrahedron(this,(triface *)&tetopb.ver);
  *(point *)(tetopb._8_8_ + (long)orgpivot[(int)tetopa.tet] * 8) = pb;
  *(point *)(tetopb._8_8_ + (long)destpivot[(int)tetopa.tet] * 8) = pc;
  *(point *)(tetopb._8_8_ + (long)apexpivot[(int)tetopa.tet] * 8) = pd;
  *(point *)(tetopb._8_8_ + (long)oppopivot[(int)tetopa.tet] * 8) = this->dummypoint;
  maketetrahedron(this,(triface *)&tetopc.ver);
  *(point *)(tetopc._8_8_ + (long)orgpivot[(int)tetopb.tet] * 8) = pc;
  *(point *)(tetopc._8_8_ + (long)destpivot[(int)tetopb.tet] * 8) = pa;
  *(point *)(tetopc._8_8_ + (long)apexpivot[(int)tetopb.tet] * 8) = pd;
  *(point *)(tetopc._8_8_ + (long)oppopivot[(int)tetopb.tet] * 8) = this->dummypoint;
  maketetrahedron(this,(triface *)&tetopd.ver);
  *(point *)(tetopd._8_8_ + (long)orgpivot[(int)tetopc.tet] * 8) = pa;
  *(point *)(tetopd._8_8_ + (long)destpivot[(int)tetopc.tet] * 8) = pb;
  *(point *)(tetopd._8_8_ + (long)apexpivot[(int)tetopc.tet] * 8) = pd;
  *(point *)(tetopd._8_8_ + (long)oppopivot[(int)tetopc.tet] * 8) = this->dummypoint;
  maketetrahedron(this,(triface *)&worktet.ver);
  *(point *)(worktet._8_8_ + (long)orgpivot[(int)tetopd.tet] * 8) = pb;
  *(point *)(worktet._8_8_ + (long)destpivot[(int)tetopd.tet] * 8) = pa;
  *(point *)(worktet._8_8_ + (long)apexpivot[(int)tetopd.tet] * 8) = pc;
  *(point *)(worktet._8_8_ + (long)oppopivot[(int)tetopd.tet] * 8) = this->dummypoint;
  this->hullsize = this->hullsize + 4;
  bond(this,(triface *)&tetopa.ver,(triface *)&worktet.ver);
  esym(this,(triface *)&tetopa.ver,(triface *)&worktet1.ver);
  bond(this,(triface *)&worktet1.ver,(triface *)&tetopd.ver);
  enextesym(this,(triface *)&tetopa.ver,(triface *)&worktet1.ver);
  bond(this,(triface *)&worktet1.ver,(triface *)&tetopb.ver);
  eprevesym(this,(triface *)&tetopa.ver,(triface *)&worktet1.ver);
  bond(this,(triface *)&worktet1.ver,(triface *)&tetopc.ver);
  esym(this,(triface *)&tetopd.ver,(triface *)&worktet1.ver);
  esym(this,(triface *)&worktet.ver,(triface *)local_a0);
  bond(this,(triface *)&worktet1.ver,(triface *)local_a0);
  esym(this,(triface *)&tetopb.ver,(triface *)&worktet1.ver);
  eprevesym(this,(triface *)&worktet.ver,(triface *)local_a0);
  bond(this,(triface *)&worktet1.ver,(triface *)local_a0);
  esym(this,(triface *)&tetopc.ver,(triface *)&worktet1.ver);
  enextesym(this,(triface *)&worktet.ver,(triface *)local_a0);
  bond(this,(triface *)&worktet1.ver,(triface *)local_a0);
  eprevesym(this,(triface *)&tetopd.ver,(triface *)&worktet1.ver);
  enextesym(this,(triface *)&tetopc.ver,(triface *)local_a0);
  bond(this,(triface *)&worktet1.ver,(triface *)local_a0);
  eprevesym(this,(triface *)&tetopb.ver,(triface *)&worktet1.ver);
  enextesym(this,(triface *)&tetopd.ver,(triface *)local_a0);
  bond(this,(triface *)&worktet1.ver,(triface *)local_a0);
  eprevesym(this,(triface *)&tetopc.ver,(triface *)&worktet1.ver);
  enextesym(this,(triface *)&tetopb.ver,(triface *)local_a0);
  bond(this,(triface *)&worktet1.ver,(triface *)local_a0);
  vVar5 = pointtype(this,pa);
  if (vVar5 == UNUSEDVERTEX) {
    setpointtype(this,pa,VOLVERTEX);
  }
  vVar5 = pointtype(this,pb);
  if (vVar5 == UNUSEDVERTEX) {
    setpointtype(this,pb,VOLVERTEX);
  }
  vVar5 = pointtype(this,pc);
  if (vVar5 == UNUSEDVERTEX) {
    setpointtype(this,pc,VOLVERTEX);
  }
  vVar5 = pointtype(this,pd);
  if (vVar5 == UNUSEDVERTEX) {
    setpointtype(this,pd,VOLVERTEX);
  }
  ppdVar6 = encode(this,(triface *)&tetopa.ver);
  setpoint2tet(this,pa,ppdVar6);
  ppdVar6 = encode(this,(triface *)&tetopa.ver);
  setpoint2tet(this,pb,ppdVar6);
  ppdVar6 = encode(this,(triface *)&tetopa.ver);
  setpoint2tet(this,pc,ppdVar6);
  ppdVar6 = encode(this,(triface *)&tetopa.ver);
  setpoint2tet(this,pd,ppdVar6);
  triface::operator=(&this->recenttet,(triface *)&tetopa.ver);
  return;
}

Assistant:

void tetgenmesh::initialdelaunay(point pa, point pb, point pc, point pd)
{
  triface firsttet, tetopa, tetopb, tetopc, tetopd;
  triface worktet, worktet1;

  if (b->verbose > 2) {
    printf("      Create init tet (%d, %d, %d, %d)\n", pointmark(pa),
           pointmark(pb), pointmark(pc), pointmark(pd));
  }

  // Create the first tetrahedron.
  maketetrahedron(&firsttet);
  setvertices(firsttet, pa, pb, pc, pd);
  // Create four hull tetrahedra.
  maketetrahedron(&tetopa);
  setvertices(tetopa, pb, pc, pd, dummypoint);
  maketetrahedron(&tetopb);
  setvertices(tetopb, pc, pa, pd, dummypoint);
  maketetrahedron(&tetopc);
  setvertices(tetopc, pa, pb, pd, dummypoint);
  maketetrahedron(&tetopd);
  setvertices(tetopd, pb, pa, pc, dummypoint);
  hullsize += 4;

  // Connect hull tetrahedra to firsttet (at four faces of firsttet).
  bond(firsttet, tetopd);
  esym(firsttet, worktet);
  bond(worktet, tetopc); // ab
  enextesym(firsttet, worktet);
  bond(worktet, tetopa); // bc 
  eprevesym(firsttet, worktet);
  bond(worktet, tetopb); // ca

  // Connect hull tetrahedra together (at six edges of firsttet).
  esym(tetopc, worktet); 
  esym(tetopd, worktet1);
  bond(worktet, worktet1); // ab
  esym(tetopa, worktet);
  eprevesym(tetopd, worktet1);
  bond(worktet, worktet1); // bc
  esym(tetopb, worktet);
  enextesym(tetopd, worktet1);
  bond(worktet, worktet1); // ca
  eprevesym(tetopc, worktet);
  enextesym(tetopb, worktet1);
  bond(worktet, worktet1); // da
  eprevesym(tetopa, worktet);
  enextesym(tetopc, worktet1);
  bond(worktet, worktet1); // db
  eprevesym(tetopb, worktet);
  enextesym(tetopa, worktet1);
  bond(worktet, worktet1); // dc

  // Set the vertex type.
  if (pointtype(pa) == UNUSEDVERTEX) {
    setpointtype(pa, VOLVERTEX);
  }
  if (pointtype(pb) == UNUSEDVERTEX) {
    setpointtype(pb, VOLVERTEX);
  }
  if (pointtype(pc) == UNUSEDVERTEX) {
    setpointtype(pc, VOLVERTEX);
  }
  if (pointtype(pd) == UNUSEDVERTEX) {
    setpointtype(pd, VOLVERTEX);
  }

  setpoint2tet(pa, encode(firsttet));
  setpoint2tet(pb, encode(firsttet));
  setpoint2tet(pc, encode(firsttet));
  setpoint2tet(pd, encode(firsttet));

  // Remember the first tetrahedron.
  recenttet = firsttet;
}